

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

void __thiscall cmCTestSVN::ExternalParser::DoPath(ExternalParser *this,string *path)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong __n;
  cmCTestSVN *pcVar3;
  int iVar4;
  _Node *p_Var5;
  string local_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long *local_40 [2];
  long local_30 [2];
  
  paVar2 = &local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  __n = (this->SVN->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_string_length;
  local_60._M_dataplus._M_p = (pointer)paVar2;
  if (__n < path->_M_string_length) {
    iVar4 = strncmp((path->_M_dataplus)._M_p,
                    (this->SVN->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_dataplus.
                    _M_p,__n);
    if (iVar4 == 0) {
      std::__cxx11::string::substr((ulong)local_40,(ulong)path);
      std::__cxx11::string::operator=((string *)&local_60,(string *)local_40);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
      goto LAB_00204b07;
    }
  }
  std::__cxx11::string::_M_assign((string *)&local_60);
LAB_00204b07:
  pcVar3 = this->SVN;
  p_Var5 = std::__cxx11::list<cmCTestSVN::SVNInfo,std::allocator<cmCTestSVN::SVNInfo>>::
           _M_create_node<std::__cxx11::string&>
                     ((list<cmCTestSVN::SVNInfo,std::allocator<cmCTestSVN::SVNInfo>> *)
                      &pcVar3->Repositories,&local_60);
  std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
  psVar1 = &(pcVar3->Repositories).
            super__List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void DoPath(std::string const& path)
  {
    // Get local path relative to the source directory
    std::string local_path;
    if (path.size() > this->SVN->SourceDirectory.size() &&
        strncmp(path.c_str(), this->SVN->SourceDirectory.c_str(),
                this->SVN->SourceDirectory.size()) == 0) {
      local_path = path.substr(this->SVN->SourceDirectory.size() + 1);
    } else {
      local_path = path;
    }
    this->SVN->Repositories.emplace_back(local_path);
  }